

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_pred.hpp
# Opt level: O0

AssertionResult * __thiscall
iutest::AssertPredVariadicHelper<bool(*)(int,int,int,int,int,int),int,int,int,int,int,int>
          (AssertionResult *__return_storage_ptr__,iutest *this,char *pred_str,char *params,
          _func_bool_int_int_int_int_int_int *pred,int args,int args_1,int args_2,int args_3,
          int args_4,int args_5)

{
  byte bVar1;
  AssertionResult *pAVar2;
  int in_stack_ffffffffffffff28;
  string local_88;
  AssertionResult local_58;
  uint local_30;
  undefined4 local_2c;
  int args_local_1;
  int args_local;
  _func_bool_int_int_int_int_int_int *pred_local;
  char *params_local;
  char *pred_str_local;
  
  local_2c = SUB84(pred,0);
  local_30 = args;
  _args_local_1 = params;
  pred_local = (_func_bool_int_int_int_int_int_int *)pred_str;
  params_local = (char *)this;
  pred_str_local = (char *)__return_storage_ptr__;
  bVar1 = (*(code *)params)((ulong)pred & 0xffffffff,args,args_1,args_2,args_3,args_4);
  if ((bVar1 & 1) == 0) {
    AssertionFailure();
    pAVar2 = AssertionResult::operator<<(&local_58,(char (*) [8])"error: ");
    pAVar2 = AssertionResult::operator<<(pAVar2,&params_local);
    pAVar2 = AssertionResult::operator<<(pAVar2,(char (*) [2])0x2741f5);
    pAVar2 = AssertionResult::operator<<(pAVar2,(char **)&pred_local);
    pAVar2 = AssertionResult::operator<<(pAVar2,(char (*) [29])") evaluates to false, where ");
    pAVar2 = AssertionResult::operator<<(pAVar2,(char (*) [2])0x270f62);
    PrintToStrings<int,int,int,int,int,int>
              (&local_88,(iutest *)0x270f62,(char *)&local_2c,(int *)(ulong)local_30,args_1,args_2,
               args_3,args_4,in_stack_ffffffffffffff28);
    pAVar2 = AssertionResult::operator<<(pAVar2,&local_88);
    AssertionResult::AssertionResult(__return_storage_ptr__,pAVar2);
    std::__cxx11::string::~string((string *)&local_88);
    AssertionResult::~AssertionResult(&local_58);
  }
  else {
    AssertionSuccess();
  }
  return __return_storage_ptr__;
}

Assistant:

AssertionResult AssertPredVariadicHelper(const char* pred_str, const char* params
    , PRED pred, Args... args)
{
    if IUTEST_COND_LIKELY( (*pred)(args...) )
    {
        return AssertionSuccess();
    }
    return AssertionFailure() << "error: " << pred_str << "("
        << params << ") evaluates to false, where "
        << "\n" << PrintToStrings("\n", args...);
}